

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O2

void __thiscall
UDPSplitPacketReader::UDPSplitPacketReader
          (UDPSplitPacketReader *this,Socket *socket,int max,int mtu)

{
  sockfd_t sVar1;
  
  sVar1 = socket->sockfd;
  *(undefined ***)this = &PTR_read_00116238;
  (this->receivedPackets).
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->receivedPackets;
  (this->receivedPackets).
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->receivedPackets;
  (this->receivedPackets).
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node._M_size = 0;
  (this->currentPacket)._M_node = (_List_node_base *)0x0;
  this->socket = sVar1;
  this->max = max;
  this->mtu = mtu;
  this->receivedPacket = false;
  return;
}

Assistant:

UDPSplitPacketReader::UDPSplitPacketReader(Socket::sockfd_t socket, int max, int mtu) {
  this->socket = socket;
  this->max = max;
  this->mtu = mtu;
  receivedPacket = false;
}